

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluation.c
# Opt level: O2

Expr gensym(pExecutor exec,pContext_conflict defContext,pContext_conflict callContext,Expr *args,
           int argc)

{
  _Bool _Var1;
  int iVar2;
  long value;
  size_t sVar3;
  anon_union_8_8_707b72ea_for_Expr_1 key;
  char *__s;
  Expr EVar4;
  Expr EVar5;
  Expr expr;
  Expr expr_00;
  Expr num;
  Expr value_00;
  Expr local_48;
  char name [7];
  
  if (argc != 0) {
    __s = "gensym: too many arguments";
    goto LAB_001041dc;
  }
  EVar4 = make_atom(exec,"*gensym-counter*");
  key = EVar4.field_1;
  expr._4_4_ = 0;
  expr.type = EVar4.type;
  expr.field_1.val_atom = key.val_atom;
  _Var1 = is_none(expr);
  if (!_Var1) {
    iVar2 = context_get(defContext,key.val_atom,&local_48);
    if (iVar2 == -1) {
LAB_00104112:
      EVar4 = make_int_one(exec);
      local_48.field_1 = EVar4.field_1;
      local_48.type = EVar4.type;
      expr_00._4_4_ = 0;
      expr_00.type = local_48.type;
      expr_00.field_1.val_atom = local_48.field_1.val_atom;
      _Var1 = is_none(expr_00);
      if (_Var1) {
        __s = "gensym: exec_int_one failed";
        goto LAB_001041dc;
      }
    }
    else {
      EVar4._4_4_ = 0;
      EVar4.type = local_48.type;
      EVar4.field_1.val_atom = local_48.field_1.val_atom;
      _Var1 = is_int(EVar4);
      if (!_Var1) goto LAB_00104112;
    }
    num._4_4_ = 0;
    num.type = local_48.type;
    num.field_1.val_atom = local_48.field_1.val_atom;
    value = exec_int_to_long(exec,num);
    while( true ) {
      sprintf(name,"#:%ld",value);
      sVar3 = find_atom(exec,name);
      if (sVar3 == 0x7ffffffe) break;
      if (sVar3 == 0x7fffffff) {
        __s = "gensym: find_atom failed";
        goto LAB_001041dc;
      }
      value = value + 1;
    }
    EVar4 = make_atom(exec,name);
    EVar5.field_1 = EVar4.field_1;
    EVar5.type = EVar4.type;
    if (EVar5.type != VT_NONE) {
      EVar4 = make_int_from_long(exec,value);
      local_48.field_1 = EVar4.field_1;
      local_48.type = EVar4.type;
      value_00._4_4_ = 0;
      value_00.type = local_48.type;
      value_00.field_1.val_atom = local_48.field_1.val_atom;
      iVar2 = context_set(defContext,key.val_atom,value_00);
      if (iVar2 != -1) {
        EVar5._4_4_ = 0;
        return EVar5;
      }
      __s = "gensym: context_bind failed";
      goto LAB_001041dc;
    }
  }
  __s = "gensym: make_atom failed";
LAB_001041dc:
  puts(__s);
  exit(1);
}

Assistant:

BUILTIN_FUNC(gensym)
{
    if (argc != 0)
    {
        log("gensym: too many arguments");
        exit(1);
    }
    Expr counter = make_atom(exec, "*gensym-counter*");
    if (is_none(counter))
    {
        log("gensym: make_atom failed");
        exit(1);
    }
    Expr value;
    if (context_get(defContext, counter.val_atom, &value) == MAP_FAILED || !is_int(value))
    {
        value = make_int_one(exec);
        if (is_none(value))
        {
            log("gensym: exec_int_one failed");
            exit(1);
        }
    }
    long n = exec_int_to_long(exec, value);
    for (;; n++)
    {
        char name[7];
        sprintf(name, "#:%ld", n);
        size_t found = find_atom(exec, name);
        if (found == EXPR_ERROR)
        {
            log("gensym: find_atom failed");
            exit(1);
        }
        if (found == EXPR_NOT_FOUND)
        {
            Expr res = make_atom(exec, name);
            if (res.type == VT_NONE)
            {
                log("gensym: make_atom failed");
                exit(1);
            }
            value = make_int_from_long(exec, n);
            if (context_set(defContext, counter.val_atom, value) == MAP_FAILED)
            {
                log("gensym: context_bind failed");
                exit(1);
            }
            return res;
        }
    }
}